

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O3

int LowMC_test_vector_192_192_30_3(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t local_58 [32];
  uint8_t local_38 [32];
  uint8_t local_18 [24];
  
  local_18[0x10] = '\0';
  local_18[0x11] = '\0';
  local_18[0x12] = '\0';
  local_18[0x13] = '\0';
  local_18[0x14] = '\0';
  local_18[0x15] = '\0';
  local_18[0x16] = '\0';
  local_18[0x17] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_58[0x10] = 'F';
  local_58[0x11] = '\r';
  local_58[0x12] = 0xcc;
  local_58[0x13] = '>';
  local_58[0x14] = 0x8e;
  local_58[0x15] = 0xfb;
  local_58[0x16] = '1';
  local_58[0x17] = '\x01';
  local_18[0] = 0xf7;
  local_18[1] = '}';
  local_18[2] = 0xb5;
  local_18[3] = '{';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  local_18[8] = '\0';
  local_18[9] = '\0';
  local_18[10] = '\0';
  local_18[0xb] = '\0';
  local_18[0xc] = '\0';
  local_18[0xd] = '\0';
  local_18[0xe] = '\0';
  local_18[0xf] = '\0';
  local_38[0] = 0xb5;
  local_38[1] = 0xdf;
  local_38[2] = 'S';
  local_38[3] = '{';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_58[0] = 0xe4;
  local_58[1] = 0x82;
  local_58[2] = 0xbc;
  local_58[3] = 0xf9;
  local_58[4] = 0xad;
  local_58[5] = ',';
  local_58[6] = '\x04';
  local_58[7] = 'H';
  local_58[8] = '1';
  local_58[9] = 'H';
  local_58[10] = 0xd4;
  local_58[0xb] = 'o';
  local_58[0xc] = 0xbe;
  local_58[0xd] = '\x1f';
  local_58[0xe] = 0x8b;
  local_58[0xf] = 'Q';
  iVar1 = lowmc_enc(&parameters_192_192_30,local_18,local_38,local_58);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_30_3(void) {
  const uint8_t key[24] = {0xF7, 0x7D, 0xB5, 0x7B, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t plaintext[24]           = {0xB5, 0xDF, 0x53, 0x7B, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t ciphertext_expected[24] = {0xE4, 0x82, 0xBC, 0xF9, 0xAD, 0x2C, 0x04, 0x48,
                                           0x31, 0x48, 0xD4, 0x6F, 0xBE, 0x1F, 0x8B, 0x51,
                                           0x46, 0x0D, 0xCC, 0x3E, 0x8E, 0xFB, 0x31, 0x01};

  return lowmc_enc(&parameters_192_192_30, key, plaintext, ciphertext_expected);
}